

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O0

void __thiscall
cmLinkLineComputer::ComputeLinkPath
          (cmLinkLineComputer *this,cmComputeLinkInformation *cli,string *libPathFlag,
          string *libPathTerminator,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkPath)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  TargetType TVar3;
  ItemVector *this_00;
  ulong uVar4;
  reference pBVar5;
  string local_2b0;
  cmAlphaNum local_290;
  cmAlphaNum local_260;
  string local_230;
  undefined1 local_210 [8];
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> libDir;
  iterator __end1;
  iterator __begin1;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  string local_190;
  string local_170;
  cmAlphaNum local_150;
  cmAlphaNum local_120;
  string local_f0;
  string local_d0;
  ArtifactType local_ac;
  cmGeneratorTarget *pcStack_a8;
  ArtifactType type;
  cmGeneratorTarget *target;
  Item *item;
  const_iterator __end2;
  const_iterator __begin2;
  ItemVector *__range2;
  string linkPathNoBT;
  string local_50;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_30;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *linkPath_local;
  string *libPathTerminator_local;
  string *libPathFlag_local;
  cmComputeLinkInformation *cli_local;
  cmLinkLineComputer *this_local;
  
  local_30 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)linkPath;
  linkPath_local =
       (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)libPathTerminator;
  libPathTerminator_local = libPathFlag;
  libPathFlag_local = (string *)cli;
  cli_local = (cmComputeLinkInformation *)this;
  cmComputeLinkInformation::GetLinkLanguage_abi_cxx11_(&local_50,cli);
  bVar2 = std::operator==(&local_50,"Swift");
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar2) {
    std::__cxx11::string::string((string *)&__range2);
    this_00 = cmComputeLinkInformation::GetItems((cmComputeLinkInformation *)libPathFlag_local);
    __end2 = std::
             vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
             ::begin(this_00);
    item = (Item *)std::
                   vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                   ::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                                       *)&item), bVar2) {
      target = (cmGeneratorTarget *)
               __gnu_cxx::
               __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
               ::operator*(&__end2);
      pcStack_a8 = *(cmGeneratorTarget **)((long)&(target->ObjectDirectory).field_2 + 8);
      if ((pcStack_a8 != (cmGeneratorTarget *)0x0) &&
         ((TVar3 = cmGeneratorTarget::GetType(pcStack_a8), TVar3 == STATIC_LIBRARY ||
          (TVar3 = cmGeneratorTarget::GetType(pcStack_a8), TVar3 == SHARED_LIBRARY)))) {
        pcVar1 = pcStack_a8;
        local_ac = RuntimeBinaryArtifact;
        cmComputeLinkInformation::GetConfig_abi_cxx11_
                  (&local_d0,(cmComputeLinkInformation *)libPathFlag_local);
        bVar2 = cmGeneratorTarget::HasImportLibrary(pcVar1,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        if (bVar2) {
          local_ac = ImportLibraryArtifact;
        }
        cmAlphaNum::cmAlphaNum(&local_120," ");
        cmAlphaNum::cmAlphaNum(&local_150,libPathTerminator_local);
        pcVar1 = *(cmGeneratorTarget **)((long)&(target->ObjectDirectory).field_2 + 8);
        cmComputeLinkInformation::GetConfig_abi_cxx11_
                  ((string *)&__range1,(cmComputeLinkInformation *)libPathFlag_local);
        cmGeneratorTarget::GetDirectory(&local_190,pcVar1,(string *)&__range1,local_ac);
        ConvertToOutputForExisting(&local_170,this,&local_190);
        cmStrCat<std::__cxx11::string,std::__cxx11::string,char[2]>
                  (&local_f0,&local_120,&local_150,&local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   linkPath_local,(char (*) [2])0xdcf81f);
        std::__cxx11::string::operator+=((string *)&__range2,(string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&__range1);
      }
      __gnu_cxx::
      __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
      ::operator++(&__end2);
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<std::__cxx11::string>
                (local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &__range2);
    }
    std::__cxx11::string::~string((string *)&__range2);
  }
  cmComputeLinkInformation::GetDirectoriesWithBacktraces_abi_cxx11_
            ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&__begin1,(cmComputeLinkInformation *)libPathFlag_local);
  __end1 = std::
           vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&__begin1);
  libDir.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&__begin1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)&libDir.Backtrace.
                                        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                        TopEntry.
                                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount), bVar2) {
    pBVar5 = __gnu_cxx::
             __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator*(&__end1);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_210,pBVar5);
    cmAlphaNum::cmAlphaNum(&local_260," ");
    cmAlphaNum::cmAlphaNum(&local_290,libPathTerminator_local);
    ConvertToOutputForExisting(&local_2b0,this,(string *)local_210);
    cmStrCat<std::__cxx11::string,std::__cxx11::string,char[2]>
              (&local_230,&local_260,&local_290,&local_2b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)linkPath_local,
               (char (*) [2])0xdcf81f);
    std::__cxx11::string::operator=((string *)local_210,(string *)&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<BT<std::__cxx11::string>&>
              (local_30,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_210);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_210);
    __gnu_cxx::
    __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&__begin1);
  return;
}

Assistant:

void cmLinkLineComputer::ComputeLinkPath(
  cmComputeLinkInformation& cli, std::string const& libPathFlag,
  std::string const& libPathTerminator, std::vector<BT<std::string>>& linkPath)
{
  if (cli.GetLinkLanguage() == "Swift") {
    std::string linkPathNoBT;

    for (const cmComputeLinkInformation::Item& item : cli.GetItems()) {
      const cmGeneratorTarget* target = item.Target;
      if (!target) {
        continue;
      }

      if (target->GetType() == cmStateEnums::STATIC_LIBRARY ||
          target->GetType() == cmStateEnums::SHARED_LIBRARY) {
        cmStateEnums::ArtifactType type = cmStateEnums::RuntimeBinaryArtifact;
        if (target->HasImportLibrary(cli.GetConfig())) {
          type = cmStateEnums::ImportLibraryArtifact;
        }

        linkPathNoBT +=
          cmStrCat(" ", libPathFlag,
                   this->ConvertToOutputForExisting(
                     item.Target->GetDirectory(cli.GetConfig(), type)),
                   libPathTerminator, " ");
      }
    }

    if (!linkPathNoBT.empty()) {
      linkPath.emplace_back(std::move(linkPathNoBT));
    }
  }

  for (BT<std::string> libDir : cli.GetDirectoriesWithBacktraces()) {
    libDir.Value = cmStrCat(" ", libPathFlag,
                            this->ConvertToOutputForExisting(libDir.Value),
                            libPathTerminator, " ");
    linkPath.emplace_back(libDir);
  }
}